

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractStringValidator.cpp
# Opt level: O1

void __thiscall
xercesc_4_0::AbstractStringValidator::serialize
          (AbstractStringValidator *this,XSerializeEngine *serEng)

{
  DatatypeValidator::serialize(&this->super_DatatypeValidator,serEng);
  if (serEng->fStoreLoad != 0) {
    XSerializeEngine::readSize(serEng,&this->fLength);
    XSerializeEngine::readSize(serEng,&this->fMaxLength);
    XSerializeEngine::readSize(serEng,&this->fMinLength);
    XSerializeEngine::operator>>(serEng,&this->fEnumerationInherited);
    XTemplateSerializer::loadObject(&this->fEnumeration,8,true,serEng);
    return;
  }
  XSerializeEngine::writeSize(serEng,this->fLength);
  XSerializeEngine::writeSize(serEng,this->fMaxLength);
  XSerializeEngine::writeSize(serEng,this->fMinLength);
  XSerializeEngine::operator<<(serEng,this->fEnumerationInherited);
  XTemplateSerializer::storeObject(this->fEnumeration,serEng);
  return;
}

Assistant:

void AbstractStringValidator::serialize(XSerializeEngine& serEng)
{

    DatatypeValidator::serialize(serEng);

    if (serEng.isStoring())
    {
        serEng.writeSize (fLength);
        serEng.writeSize (fMaxLength);
        serEng.writeSize (fMinLength);
        serEng<<fEnumerationInherited;

        /***
         *
         * Serialize RefArrayVectorOf<XMLCh>
         *
         ***/
        XTemplateSerializer::storeObject(fEnumeration, serEng);

    }
    else
    {
        serEng.readSize (fLength);
        serEng.readSize (fMaxLength);
        serEng.readSize (fMinLength);
        serEng>>fEnumerationInherited;

        /***
         *
         *  Deserialize RefArrayVectorOf<XMLCh>
         *
        ***/
        XTemplateSerializer::loadObject(&fEnumeration, 8, true, serEng);

    }

}